

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O1

shared_ptr<minja::TemplateNode> __thiscall
minja::Parser::parse(Parser *this,string *template_str,Options *options)

{
  element_type *peVar1;
  pointer pcVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  shared_ptr<minja::TemplateNode> sVar5;
  TemplateTokenVector tokens;
  TemplateTokenIterator begin;
  TemplateTokenIterator end;
  TemplateTokenIterator it;
  Parser parser;
  undefined1 local_88 [17];
  undefined7 uStack_77;
  undefined8 uStack_70;
  shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_68;
  pointer local_58;
  TemplateTokenIterator local_50;
  Parser local_48;
  
  peVar1 = (element_type *)(local_88 + 0x10);
  pcVar2 = (template_str->_M_dataplus)._M_p;
  local_88._0_8_ = peVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_88,pcVar2,pcVar2 + template_str->_M_string_length);
  local_68.
  super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  local_68.
  super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x30);
  (local_68.
   super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
   ._M_refcount._M_pi)->_M_use_count = 1;
  (local_68.
   super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
   ._M_refcount._M_pi)->_M_weak_count = 1;
  (local_68.
   super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
   ._M_refcount._M_pi)->_vptr__Sp_counted_base =
       (_func_int **)&PTR___Sp_counted_ptr_inplace_002018e8;
  local_68.
  super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)
            (local_68.
             super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi + 1);
  p_Var3 = local_68.
           super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi + 2;
  local_68.
  super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi[1]._vptr__Sp_counted_base = (_func_int **)p_Var3;
  if ((element_type *)local_88._0_8_ == peVar1) {
    p_Var3->_vptr__Sp_counted_base = (_func_int **)CONCAT71(uStack_77,local_88[0x10]);
    local_68.
    super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi[2]._M_use_count = (undefined4)uStack_70;
    local_68.
    super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi[2]._M_weak_count = uStack_70._4_4_;
  }
  else {
    ((local_68.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
     ._M_ptr)->_M_dataplus)._M_p = (pointer)local_88._0_8_;
    p_Var3->_vptr__Sp_counted_base = (_func_int **)CONCAT71(uStack_77,local_88[0x10]);
  }
  local_68.
  super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi[1]._M_use_count = local_88._8_4_;
  local_68.
  super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi[1]._M_weak_count = local_88._12_4_;
  local_88._8_8_ = (pointer)0x0;
  local_88[0x10] = 0;
  local_88._0_8_ = peVar1;
  Parser(&local_48,&local_68,options);
  if (local_68.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_68.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if ((element_type *)local_88._0_8_ != peVar1) {
    operator_delete((void *)local_88._0_8_,CONCAT71(uStack_77,local_88[0x10]) + 1);
  }
  tokenize((TemplateTokenVector *)local_88,&local_48);
  local_68.
  super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)local_88._0_8_;
  local_50._M_current =
       (unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_> *)
       local_88._0_8_;
  local_58 = (pointer)local_88._8_8_;
  parseTemplate(this,(TemplateTokenIterator *)&local_48,(TemplateTokenIterator *)&local_68,&local_50
                ,SUB81(&local_58,0));
  std::
  vector<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>,_std::allocator<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_>_>
  ::~vector((vector<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>,_std::allocator<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_>_>
             *)local_88);
  _Var4._M_pi = extraout_RDX;
  if (local_48.template_str.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_48.template_str.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
    _Var4._M_pi = extraout_RDX_00;
  }
  sVar5.super___shared_ptr<minja::TemplateNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var4._M_pi;
  sVar5.super___shared_ptr<minja::TemplateNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<minja::TemplateNode>)
         sVar5.super___shared_ptr<minja::TemplateNode,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static std::shared_ptr<TemplateNode> parse(const std::string& template_str, const Options & options) {
        Parser parser(std::make_shared<std::string>(normalize_newlines(template_str)), options);
        auto tokens = parser.tokenize();
        TemplateTokenIterator begin = tokens.begin();
        auto it = begin;
        TemplateTokenIterator end = tokens.end();
        return parser.parseTemplate(begin, it, end, /* fully= */ true);
    }